

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_7c638b::BacktraceData::Add
          (BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  cmListFileContext *value;
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var5;
  Value *pVVar6;
  mapped_type *pmVar7;
  string *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar8;
  cmListFileContext *top;
  Value *local_160;
  undefined1 local_158 [40];
  ArrayIndex *local_130;
  _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_128;
  ArrayIndex fileIndex;
  ArrayIndex parent;
  Value entry;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  bVar1 = cmListFileBacktrace::Empty(bt);
  if (!bVar1) {
    top = cmListFileBacktrace::Top(bt);
    iVar4 = std::
            _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->NodeMap)._M_h,&top);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_130 = index;
      local_128 = (_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->NodeMap;
      Json::Value::Value(&entry,objectValue);
      __k = &top->FilePath;
      _Var5._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->FileMap)._M_h,__k);
      if (_Var5._M_cur == (__node_type *)0x0) {
        local_160 = &this->Files;
        fileIndex = Json::Value::size(local_160);
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->FileMap,__k);
        _Var5._M_cur = (__node_type *)
                       pVar8.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur;
        RelativeIfUnder((string *)&parent,&this->TopSource,__k);
        Json::Value::Value((Value *)local_158,(string *)&parent);
        Json::Value::append(local_160,(Value *)local_158);
        Json::Value::~Value((Value *)local_158);
        std::__cxx11::string::~string((string *)&parent);
      }
      Json::Value::Value(&local_58,
                         *(UInt *)((long)&((_Var5._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                          ._M_storage._M_storage + 0x20));
      pVVar6 = Json::Value::operator[](&entry,"file");
      Json::Value::operator=(pVVar6,&local_58);
      Json::Value::~Value(&local_58);
      if (top->Line != 0) {
        Json::Value::Value(&local_80,(Int)top->Line);
        pVVar6 = Json::Value::operator[](&entry,"line");
        Json::Value::operator=(pVVar6,&local_80);
        Json::Value::~Value(&local_80);
      }
      value = top;
      if ((top->Name)._M_string_length != 0) {
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->CommandMap)._M_h,&top->Name);
        if (_Var5._M_cur == (__node_type *)0x0) {
          local_160 = &this->Commands;
          parent = Json::Value::size(local_160);
          pVar8 = std::
                  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              *)&this->CommandMap,value);
          _Var5._M_cur = (__node_type *)
                         pVar8.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                         ._M_cur;
          Json::Value::Value((Value *)local_158,&value->Name);
          Json::Value::append(local_160,(Value *)local_158);
          Json::Value::~Value((Value *)local_158);
        }
        Json::Value::Value(&local_a8,
                           *(UInt *)((long)&((_Var5._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                            ._M_storage._M_storage + 0x20));
        pVVar6 = Json::Value::operator[](&entry,"command");
        Json::Value::operator=(pVVar6,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      cmListFileBacktrace::Pop((cmListFileBacktrace *)local_158);
      bVar2 = Add(this,(cmListFileBacktrace *)local_158,&parent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
      if (bVar2) {
        Json::Value::Value(&local_d0,parent);
        pVVar6 = Json::Value::operator[](&entry,"parent");
        Json::Value::operator=(pVVar6,&local_d0);
        Json::Value::~Value(&local_d0);
      }
      AVar3 = Json::Value::size(&this->Nodes);
      pmVar7 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_128,&top);
      *pmVar7 = AVar3;
      *local_130 = AVar3;
      Json::Value::append(&this->Nodes,&entry);
      Json::Value::~Value(&entry);
    }
    else {
      *index = *(ArrayIndex *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                       ._M_cur + 0x10);
    }
  }
  return !bVar1;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}